

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

void __thiscall
FreeTypeFaceWrapper::FreeTypeFaceWrapper
          (FreeTypeFaceWrapper *this,FT_Face inFace,string *inFontFilePath,string *inPFMFilePath,
          long inFontIndex,bool inDoOwn)

{
  int iVar1;
  FreeTypeFaceWrapper *this_00;
  string fileExtension;
  string local_70;
  string local_50;
  
  (this->mFontFilePath)._M_dataplus._M_p = (pointer)&(this->mFontFilePath).field_2;
  (this->mFontFilePath)._M_string_length = 0;
  (this->mFontFilePath).field_2._M_local_buf[0] = '\0';
  (this->mNotDefGlyphName)._M_dataplus._M_p = (pointer)&(this->mNotDefGlyphName).field_2;
  (this->mNotDefGlyphName)._M_string_length = 0;
  (this->mNotDefGlyphName).field_2._M_local_buf[0] = '\0';
  this->mFace = inFace;
  this_00 = (FreeTypeFaceWrapper *)inFontFilePath;
  std::__cxx11::string::_M_assign((string *)&this->mFontFilePath);
  this->mFontIndex = inFontIndex;
  this->mDoesOwn = inDoOwn;
  this->mGlyphIsLoaded = false;
  this->mPaletteSet = false;
  this->mPalette = (FT_Color *)0x0;
  this->mPaletteStatus = 0;
  GetExtension(&local_50,this_00,inPFMFilePath);
  iVar1 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar1 != 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      SetupFormatSpecificExtender(this,inFontFilePath,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001b367a;
    }
  }
  SetupFormatSpecificExtender(this,inFontFilePath,inPFMFilePath);
LAB_001b367a:
  SelectDefaultEncoding(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FreeTypeFaceWrapper::FreeTypeFaceWrapper(FT_Face inFace,const std::string& inFontFilePath,const std::string& inPFMFilePath,long inFontIndex, bool inDoOwn)
{
    mFace = inFace;
	mFontFilePath = inFontFilePath;
    mFontIndex = inFontIndex;
	mDoesOwn = inDoOwn;
	mGlyphIsLoaded = false;
	ResetPaletteSelectionState();
	std::string fileExtension = GetExtension(inPFMFilePath);
	if (fileExtension == "PFM" || fileExtension == "pfm") // just don't bother if it's not PFM
		SetupFormatSpecificExtender(inFontFilePath, inPFMFilePath);
	else
		SetupFormatSpecificExtender(inFontFilePath, "");
	SelectDefaultEncoding();
}